

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quote_conversion.cpp
# Opt level: O0

void __thiscall
skiwi::anon_unknown_26::quote_conversion_visitor::_convert
          (quote_conversion_visitor *this,Expression *e)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
  *this_00;
  map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
  *this_01;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *pmVar1;
  environment_entry e_00;
  bool bVar2;
  element_type *this_02;
  ostream *poVar3;
  pointer ppVar4;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_unsigned_long>_>::value,_pair<iterator,_bool>_>
  _Var5;
  string local_920 [32];
  key_type local_900;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  local_8e0;
  stringstream local_8d8 [8];
  stringstream qs;
  ostream local_8c8 [376];
  undefined1 local_750 [8];
  Variable v;
  key_type local_6e8;
  _Self local_6c8;
  undefined8 *local_6c0;
  uint64_t *addr;
  environment_entry eStack_6b0;
  undefined1 auStack_690 [8];
  environment_entry ee;
  Expression local_580;
  string local_490 [32];
  _Base_ptr local_470;
  undefined1 local_468;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
  local_440;
  stringstream local_418 [8];
  stringstream qs_1;
  ostream local_408 [376];
  undefined1 local_290 [8];
  Set s;
  key_type local_210;
  _Self local_1f0;
  iterator it2;
  key_type local_1e0;
  _Self local_1c0;
  iterator it;
  stringstream local_1a8 [8];
  stringstream str;
  ostream local_198 [376];
  Quote *local_20;
  Quote *q;
  Expression *e_local;
  quote_conversion_visitor *this_local;
  
  q = (Quote *)e;
  e_local = (Expression *)this;
  bVar2 = std::
          holds_alternative<skiwi::Quote,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                    (e);
  if (!bVar2) {
    __assert_fail("std::holds_alternative<Quote>(e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quote_conversion.cpp"
                  ,0x159,
                  "void skiwi::(anonymous namespace)::quote_conversion_visitor::_convert(Expression &)"
                 );
  }
  local_20 = std::
             get<skiwi::Quote,skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                       ((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                         *)q);
  std::__cxx11::stringstream::stringstream(local_1a8);
  operator<<(local_198,&local_20->arg);
  this_00 = this->new_quotes;
  std::__cxx11::stringstream::str();
  local_1c0._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
       ::find(this_00,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  it2._M_node = (_Base_ptr)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cell>_>_>
                ::end(this->new_quotes);
  bVar2 = std::operator!=(&local_1c0,(_Self *)&it2);
  if (bVar2) {
    pmVar1 = this->quote_to_index;
    std::__cxx11::stringstream::str();
    local_1f0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find(pmVar1,&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    s.filename.field_2._8_8_ =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::end(this->quote_to_index);
    bVar2 = std::operator==(&local_1f0,(_Self *)((long)&s.filename.field_2 + 8));
    if (bVar2) {
      Set::Set((Set *)local_290);
      s.value.
      super__Vector_base<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
      std::__cxx11::stringstream::stringstream(local_418);
      poVar3 = std::operator<<(local_408,"#%q");
      std::ostream::operator<<(poVar3,this->index);
      this_01 = (map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                 *)this->quote_to_index;
      std::__cxx11::stringstream::str();
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long_&,_true>
                (&local_440,&local_460,&this->index);
      _Var5 = std::
              map<std::__cxx11::string,unsigned_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
              ::insert<std::pair<std::__cxx11::string,unsigned_long>>(this_01,&local_440);
      local_470 = (_Base_ptr)_Var5.first._M_node;
      local_468 = _Var5.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>
      ::~pair(&local_440);
      std::__cxx11::string::~string((string *)&local_460);
      this->index = this->index + 1;
      std::__cxx11::stringstream::str();
      std::__cxx11::string::operator=((string *)&s,local_490);
      std::__cxx11::string::~string(local_490);
      _parse(&local_580,this,&local_20->arg);
      std::
      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
      ::push_back((vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
                   *)((long)&s.name.field_2 + 8),&local_580);
      std::
      variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ::~variant(&local_580);
      std::
      variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
      ::variant<skiwi::Set&,void,void,skiwi::Set,void>
                ((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                  *)&ee.live_range.last,(Set *)local_290);
      std::
      vector<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>,_std::allocator<std::variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>_>_>
      ::push_back(&this->quotes,(value_type *)&ee.live_range.last);
      std::
      variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
      ::~variant((variant<skiwi::Begin,_skiwi::Case,_skiwi::Cond,_skiwi::Do,_skiwi::ForeignCall,_skiwi::FunCall,_skiwi::If,_skiwi::Lambda,_skiwi::Let,_std::variant<skiwi::Character,_skiwi::False,_skiwi::Fixnum,_skiwi::Flonum,_skiwi::Nil,_skiwi::String,_skiwi::Symbol,_skiwi::True>,_skiwi::Nop,_skiwi::PrimitiveCall,_skiwi::Quote,_skiwi::Set,_skiwi::Variable>
                  *)&ee.live_range.last);
      environment_entry::environment_entry((environment_entry *)auStack_690);
      auStack_690._0_4_ = st_global;
      ee._0_8_ = this->rd->global_index << 3;
      this->rd->global_index = this->rd->global_index + 1;
      this_02 = std::
                __shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)&this->env);
      addr = (uint64_t *)CONCAT44(auStack_690._4_4_,auStack_690._0_4_);
      eStack_6b0.pos = ee.pos;
      eStack_6b0.live_range.first = ee.live_range.first;
      eStack_6b0.st = ee.st;
      eStack_6b0._4_4_ = ee._4_4_;
      e_00.pos = ee._0_8_;
      e_00._0_8_ = addr;
      e_00.live_range.first = ee.pos;
      e_00.live_range.last = ee.live_range.first;
      environment<skiwi::environment_entry>::push_outer(this_02,(string *)&s,e_00);
      local_6c0 = (undefined8 *)((long)this->p_ctxt->globals + (ee._0_8_ & 0xfffffffffffffff8));
      *local_6c0 = 0x5f;
      std::__cxx11::stringstream::~stringstream(local_418);
      Set::~Set((Set *)local_290);
    }
  }
  pmVar1 = this->quote_to_index;
  std::__cxx11::stringstream::str();
  local_6c8._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::find(pmVar1,&local_6e8);
  v.filename.field_2._8_8_ =
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
       ::end(this->quote_to_index);
  bVar2 = std::operator!=(&local_6c8,(_Self *)((long)&v.filename.field_2 + 8));
  if (bVar2) {
    std::__cxx11::string::~string((string *)&local_6e8);
    Variable::Variable((Variable *)local_750);
    std::__cxx11::stringstream::stringstream(local_8d8);
    poVar3 = std::operator<<(local_8c8,"#%q");
    pmVar1 = this->quote_to_index;
    std::__cxx11::stringstream::str();
    local_8e0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find(pmVar1,&local_900);
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
             ::operator->(&local_8e0);
    std::ostream::operator<<(poVar3,ppVar4->second);
    std::__cxx11::string::~string((string *)&local_900);
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator=((string *)&v,local_920);
    std::__cxx11::string::~string(local_920);
    std::
    variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
    ::operator=((variant<skiwi::Begin,skiwi::Case,skiwi::Cond,skiwi::Do,skiwi::ForeignCall,skiwi::FunCall,skiwi::If,skiwi::Lambda,skiwi::Let,std::variant<skiwi::Character,skiwi::False,skiwi::Fixnum,skiwi::Flonum,skiwi::Nil,skiwi::String,skiwi::Symbol,skiwi::True>,skiwi::Nop,skiwi::PrimitiveCall,skiwi::Quote,skiwi::Set,skiwi::Variable>
                 *)q,(Variable *)local_750);
    std::__cxx11::stringstream::~stringstream(local_8d8);
    Variable::~Variable((Variable *)local_750);
    std::__cxx11::stringstream::~stringstream(local_1a8);
    return;
  }
  __assert_fail("quote_to_index->find(str.str()) != quote_to_index->end()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quote_conversion.cpp"
                ,0x175,
                "void skiwi::(anonymous namespace)::quote_conversion_visitor::_convert(Expression &)"
               );
}

Assistant:

void _convert(Expression& e)
      {
      assert(std::holds_alternative<Quote>(e));
      Quote& q = std::get<Quote>(e);
      std::stringstream str;
      str << q.arg;
      auto it = new_quotes->find(str.str());
      if (it != new_quotes->end())
        {
        auto it2 = quote_to_index->find(str.str());
        if (it2 == quote_to_index->end())
          {
          Set s;
          s.originates_from_quote = true;
          std::stringstream qs;
          qs << "#%q" << index;
          quote_to_index->insert(std::pair<std::string, uint64_t>(str.str(), index));
          ++index;
          s.name = qs.str();
          s.value.push_back(_parse(q.arg));
          quotes.push_back(s);
          environment_entry ee;
          ee.st = environment_entry::st_global;
          ee.pos = (uint64_t)rd->global_index * 8;
          ++(rd->global_index);
          env->push_outer(s.name, ee);
          uint64_t* addr = p_ctxt->globals + (ee.pos >> 3);
          *addr = reserved_tag; // This is a new address, previously equal to unalloc_tag. To avoid that gc stops here when cleaning, we change its value to reserved_tag.
          }
        }
      assert(quote_to_index->find(str.str()) != quote_to_index->end());
      Variable v;
      std::stringstream qs;
      qs << "#%q" << quote_to_index->find(str.str())->second;
      v.name = qs.str();
      e = v;
      }